

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomSubset *subset,uint32_t indent,
          bool closing_brace)

{
  string *psVar1;
  ostream *poVar2;
  uint indent_00;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_01;
  uint indent_02;
  pprint *this_00;
  stringstream ss;
  allocator local_20d;
  uint32_t local_20c;
  string local_208;
  pprint *local_1e8;
  string *local_1e0;
  undefined1 local_1d8 [48];
  ostream local_1a8 [376];
  
  indent_01 = CONCAT31(in_register_00000081,closing_brace);
  this_00 = (pprint *)((ulong)subset & 0xffffffff);
  local_20c = indent;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x20));
  pprint::Indent_abi_cxx11_(&local_208,this_00,n);
  poVar2 = std::operator<<(local_1a8,(string *)&local_208);
  to_string_abi_cxx11_((string *)local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0x9f8),s);
  poVar2 = std::operator<<(poVar2,(string *)local_1d8);
  poVar2 = std::operator<<(poVar2," GeomSubset \"");
  poVar2 = std::operator<<(poVar2,(string *)(this + 0x9d8));
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)subset & 0xffffffff),n_00);
  poVar2 = std::operator<<(local_1a8,(string *)&local_208);
  std::operator<<(poVar2,"(\n");
  std::__cxx11::string::_M_dispose();
  indent_02 = (int)subset + 1;
  print_prim_metas_abi_cxx11_(&local_208,this + 0x1140,(PrimMeta *)(ulong)indent_02,indent);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  pprint::Indent_abi_cxx11_(&local_208,this_00,n_01);
  poVar2 = std::operator<<(local_1a8,(string *)&local_208);
  std::operator<<(poVar2,")\n");
  std::__cxx11::string::_M_dispose();
  local_1e8 = this_00;
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)subset & 0xffffffff),n_02);
  poVar2 = std::operator<<(local_1a8,(string *)&local_208);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)local_1d8,"elementType",&local_20d);
  print_typed_token_attr<tinyusdz::GeomSubset::ElementType>
            (&local_208,
             (TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *)(this + 0xa08),
             (string *)local_1d8,indent_02);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)local_1d8,"familyName",&local_20d);
  print_typed_attr<tinyusdz::Token>
            (&local_208,(TypedAttribute<tinyusdz::Token> *)(this + 0xc40),(string *)local_1d8,
             indent_02);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)local_1d8,"indices",&local_20d);
  indent_00 = indent_02;
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_208,this + 0xe98,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1d8,(string *)(ulong)indent_02,indent_01);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  print_material_binding_abi_cxx11_(&local_208,this,(MaterialBinding *)(ulong)indent_02,indent_00);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  print_collection_abi_cxx11_(&local_208,this + 0x990,(Collection *)(ulong)indent_02,indent_00);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  print_props(&local_208,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1110),indent_02);
  std::operator<<(local_1a8,(string *)&local_208);
  std::__cxx11::string::_M_dispose();
  if (local_20c != 0) {
    pprint::Indent_abi_cxx11_(&local_208,local_1e8,n_03);
    poVar2 = std::operator<<(local_1a8,(string *)&local_208);
    std::operator<<(poVar2,"}\n");
    std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x20));
  return psVar1;
}

Assistant:

std::string to_string(const GeomSubset &subset, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(subset.spec) << " GeomSubset \""
     << subset.name << "\"\n";
  ss << pprint::Indent(indent) << "(\n";
  ss << print_prim_metas(subset.meta, indent + 1);
  ss << pprint::Indent(indent) << ")\n";
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_token_attr(subset.elementType, "elementType", indent + 1);
  ss << print_typed_attr(subset.familyName, "familyName", indent + 1);
  ss << print_typed_attr(subset.indices, "indices", indent + 1);

  ss << print_material_binding(&subset, indent + 1);
  ss << print_collection(&subset, indent + 1);

  ss << print_props(subset.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}